

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::int_writer<long_long,_fmt::v5::basic_format_specs<char>_>::on_dec
          (int_writer<long_long,_fmt::v5::basic_format_specs<char>_> *this)

{
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *this_00;
  dec_writer f;
  uint num_digits_00;
  string_view prefix;
  undefined4 uStack_2c;
  uint num_digits;
  int_writer<long_long,_fmt::v5::basic_format_specs<char>_> *this_local;
  
  num_digits_00 = internal::count_digits(this->abs_value);
  this_00 = this->writer;
  prefix = get_prefix(this);
  f._12_4_ = uStack_2c;
  f.num_digits = num_digits_00;
  f.abs_value = this->abs_value;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
  ::
  write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::dec_writer>
            ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              *)this_00,num_digits_00,prefix,this->spec,f);
  return;
}

Assistant:

void on_dec() {
      unsigned num_digits = internal::count_digits(abs_value);
      writer.write_int(num_digits, get_prefix(), spec,
                       dec_writer{abs_value, num_digits});
    }